

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O0

int cuddLinearInPlace(DdManager *table,int x,int y)

{
  int x_00;
  DdHalfWord y_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  DdHalfWord DVar5;
  DdHalfWord DVar6;
  DdNode **ppDVar7;
  DdNode **ppDVar8;
  DdManager *pDVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  DdNode *pDVar12;
  DdManager *pDVar13;
  int iVar14;
  DdNode *pDVar15;
  ulong uVar16;
  byte bVar17;
  bool bVar18;
  DdNode *sentinel;
  DdNode *tmp;
  DdNodePtr *previousP;
  DdNode *last;
  DdNode *next;
  DdNode *g;
  DdNode *newf0;
  DdNode *newf1;
  DdNode *f10;
  DdNode *f11;
  DdNode *f00;
  DdNode *f01;
  DdNode *f1;
  DdNode *f0;
  DdNode *f;
  int isolated;
  int posn;
  int i;
  int newcomplement;
  int comple;
  int newykeys;
  int newxkeys;
  int oldykeys;
  int oldxkeys;
  int yshift;
  int xshift;
  int yslots;
  int xslots;
  int yindex;
  int xindex;
  DdNodePtr *ylist;
  DdNodePtr *xlist;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  previousP = (DdNodePtr *)0x0;
  x_00 = table->invperm[x];
  y_00 = table->invperm[y];
  iVar14 = cuddTestInteract(table,x_00,y_00);
  if (iVar14 != 0) {
    ppDVar7 = table->subtables[x].nodelist;
    uVar1 = table->subtables[x].slots;
    iVar14 = table->subtables[x].shift;
    ppDVar8 = table->subtables[y].nodelist;
    uVar2 = table->subtables[y].keys;
    uVar3 = table->subtables[y].slots;
    iVar4 = table->subtables[y].shift;
    DVar5 = table->vars[x_00]->ref;
    DVar6 = table->vars[(int)y_00]->ref;
    next = (DdNode *)0x0;
    for (isolated = 0; isolated < (int)uVar1; isolated = isolated + 1) {
      pDVar9 = (DdManager *)ppDVar7[isolated];
      if (pDVar9 != table) {
        ppDVar7[isolated] = &table->sentinel;
        pDVar13 = pDVar9;
        if (next != (DdNode *)0x0) {
          previousP[1] = (DdNodePtr)pDVar9;
          pDVar13 = (DdManager *)next;
        }
        do {
          next = &pDVar13->sentinel;
          f0 = &pDVar9->sentinel;
          pDVar9 = (DdManager *)f0->next;
          pDVar13 = (DdManager *)next;
        } while ((DdManager *)f0->next != table);
        previousP = (DdNodePtr *)f0;
      }
    }
    previousP[1] = (DdNodePtr)0x0;
    f0 = next;
    newcomplement = uVar2;
    while (f0 != (DdNode *)0x0) {
      pDVar10 = f0->next;
      pDVar11 = (f0->type).kids.T;
      newf1 = pDVar11;
      f10 = pDVar11;
      if (pDVar11->index == y_00) {
        newf1 = (pDVar11->type).kids.E;
        f10 = (pDVar11->type).kids.T;
      }
      pDVar12 = (f0->type).kids.E;
      pDVar15 = (DdNode *)((ulong)pDVar12 & 0xfffffffffffffffe);
      f11 = pDVar15;
      f00 = pDVar15;
      if (pDVar15->index == y_00) {
        f11 = (pDVar15->type).kids.E;
        f00 = (pDVar15->type).kids.T;
      }
      if (((ulong)pDVar12 & 1) != 0) {
        f00 = (DdNode *)((ulong)f00 ^ 1);
        f11 = (DdNode *)((ulong)f11 ^ 1);
      }
      pDVar11->ref = pDVar11->ref - 1;
      bVar17 = (byte)iVar4;
      if (f10 == f11) {
        newf0 = f10;
        f10->ref = f10->ref + 1;
      }
      else {
        tmp = (DdNode *)
              (ppDVar8 +
              (int)((((uint)(*(long *)(((ulong)f10 & 0xfffffffffffffffe) + 0x20) << 1) |
                     (uint)f10 & 1) * 0xc00005 +
                    ((uint)(*(long *)(((ulong)f11 & 0xfffffffffffffffe) + 0x20) << 1) |
                    (uint)f11 & 1)) * 0x40f1f9 >> (bVar17 & 0x1f)));
        newf0 = *(DdNode **)tmp;
        while (f10 < (newf0->type).kids.T) {
          tmp = (DdNode *)&newf0->next;
          newf0 = *(DdNode **)tmp;
        }
        while( true ) {
          bVar18 = false;
          if (f10 == (newf0->type).kids.T) {
            bVar18 = f11 < (newf0->type).kids.E;
          }
          if (!bVar18) break;
          tmp = (DdNode *)&newf0->next;
          newf0 = *(DdNode **)tmp;
        }
        if (((newf0->type).kids.T == f10) && ((newf0->type).kids.E == f11)) {
          newf0->ref = newf0->ref + 1;
        }
        else {
          newf0 = cuddDynamicAllocNode(table);
          if (newf0 == (DdNode *)0x0) goto LAB_00c05307;
          newf0->index = y_00;
          newf0->ref = 1;
          (newf0->type).kids.T = f10;
          (newf0->type).kids.E = f11;
          newcomplement = newcomplement + 1;
          newf0->next = *(DdNode **)tmp;
          *(DdNode **)tmp = newf0;
          f10->ref = f10->ref + 1;
          *(int *)(((ulong)f11 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)f11 & 0xfffffffffffffffe) + 4) + 1;
        }
      }
      (f0->type).kids.T = newf0;
      pDVar15->ref = pDVar15->ref - 1;
      if (f00 == newf1) {
        g = f00;
        *(int *)(((ulong)f00 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)f00 & 0xfffffffffffffffe) + 4) + 1;
      }
      else {
        uVar16 = (ulong)f00 & 1;
        if (((ulong)f00 & 1) != 0) {
          f00 = (DdNode *)((ulong)f00 ^ 1);
          newf1 = (DdNode *)((ulong)newf1 ^ 1);
        }
        tmp = (DdNode *)
              (ppDVar8 +
              (int)((((uint)(*(long *)(((ulong)f00 & 0xfffffffffffffffe) + 0x20) << 1) |
                     (uint)f00 & 1) * 0xc00005 +
                    ((uint)(*(long *)(((ulong)newf1 & 0xfffffffffffffffe) + 0x20) << 1) |
                    (uint)newf1 & 1)) * 0x40f1f9 >> (bVar17 & 0x1f)));
        g = *(DdNode **)tmp;
        while (f00 < (g->type).kids.T) {
          tmp = (DdNode *)&g->next;
          g = *(DdNode **)tmp;
        }
        while( true ) {
          bVar18 = false;
          if (f00 == (g->type).kids.T) {
            bVar18 = newf1 < (g->type).kids.E;
          }
          if (!bVar18) break;
          tmp = (DdNode *)&g->next;
          g = *(DdNode **)tmp;
        }
        if (((g->type).kids.T == f00) && ((g->type).kids.E == newf1)) {
          g->ref = g->ref + 1;
        }
        else {
          g = cuddDynamicAllocNode(table);
          if (g == (DdNode *)0x0) {
LAB_00c05307:
            fprintf((FILE *)table->err,"Error: cuddLinearInPlace out of memory\n");
            return 0;
          }
          g->index = y_00;
          g->ref = 1;
          (g->type).kids.T = f00;
          (g->type).kids.E = newf1;
          newcomplement = newcomplement + 1;
          g->next = *(DdNode **)tmp;
          *(DdNode **)tmp = g;
          f00->ref = f00->ref + 1;
          *(int *)(((ulong)newf1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)newf1 & 0xfffffffffffffffe) + 4) + 1;
        }
        if (uVar16 != 0) {
          g = (DdNode *)((ulong)g ^ 1);
        }
      }
      (f0->type).kids.E = g;
      tmp = (DdNode *)
            (ppDVar7 +
            (int)((((uint)(*(long *)(((ulong)newf0 & 0xfffffffffffffffe) + 0x20) << 1) |
                   (uint)newf0 & 1) * 0xc00005 +
                  ((uint)(*(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) << 1) | (uint)g & 1)) *
                  0x40f1f9 >> ((byte)iVar14 & 0x1f)));
      sentinel = *(DdNode **)tmp;
      while (newf0 < (sentinel->type).kids.T) {
        tmp = (DdNode *)&sentinel->next;
        sentinel = *(DdNode **)tmp;
      }
      while( true ) {
        bVar18 = false;
        if (newf0 == (sentinel->type).kids.T) {
          bVar18 = g < (sentinel->type).kids.E;
        }
        if (!bVar18) break;
        tmp = (DdNode *)&sentinel->next;
        sentinel = *(DdNode **)tmp;
      }
      f0->next = *(DdNode **)tmp;
      *(DdNode **)tmp = f0;
      f0 = pDVar10;
    }
    for (isolated = 0; isolated < (int)uVar3; isolated = isolated + 1) {
      tmp = (DdNode *)(ppDVar8 + isolated);
      f0 = *(DdNode **)tmp;
      while ((DdManager *)f0 != table) {
        pDVar10 = f0->next;
        if (f0->ref == 0) {
          pDVar11 = (f0->type).kids.T;
          pDVar11->ref = pDVar11->ref - 1;
          uVar16 = (ulong)(f0->type).kids.E & 0xfffffffffffffffe;
          *(int *)(uVar16 + 4) = *(int *)(uVar16 + 4) + -1;
          f0->next = table->nextFree;
          table->nextFree = f0;
          newcomplement = newcomplement + -1;
          f0 = pDVar10;
        }
        else {
          *(DdNode **)tmp = f0;
          tmp = (DdNode *)&f0->next;
          f0 = pDVar10;
        }
      }
      *(DdManager **)tmp = table;
    }
    table->isolated =
         (((uint)(table->vars[x_00]->ref == 1) + (uint)(table->vars[(int)y_00]->ref == 1)) -
         ((uint)(DVar5 == 1) + (uint)(DVar6 == 1))) + table->isolated;
    table->subtables[y].keys = newcomplement;
    table->keys = (newcomplement - uVar2) + table->keys;
    cuddXorLinear(table,x_00,y_00);
  }
  return table->keys - table->isolated;
}

Assistant:

int
cuddLinearInPlace(
  DdManager * table,
  int  x,
  int  y)
{
    DdNodePtr *xlist, *ylist;
    int    xindex, yindex;
    int    xslots, yslots;
    int    xshift, yshift;
    int    oldxkeys, oldykeys;
    int    newxkeys, newykeys;
    int    comple, newcomplement;
    int    i;
    int    posn;
    int    isolated;
    DdNode *f,*f0,*f1,*f01,*f00,*f11,*f10,*newf1,*newf0;
    DdNode *g,*next,*last=NULL;
    DdNodePtr *previousP;
    DdNode *tmp;
    DdNode *sentinel = &(table->sentinel);
#ifdef DD_DEBUG
    int    count, idcheck;
#endif

#ifdef DD_DEBUG
    assert(x < y);
    assert(cuddNextHigh(table,x) == y);
    assert(table->subtables[x].keys != 0);
    assert(table->subtables[y].keys != 0);
    assert(table->subtables[x].dead == 0);
    assert(table->subtables[y].dead == 0);
#endif

    xindex = table->invperm[x];
    yindex = table->invperm[y];

    if (cuddTestInteract(table,xindex,yindex)) {
#ifdef DD_STATS
        ddTotalNumberLinearTr++;
#endif
        /* Get parameters of x subtable. */
        xlist = table->subtables[x].nodelist;
        oldxkeys = table->subtables[x].keys;
        xslots = table->subtables[x].slots;
        xshift = table->subtables[x].shift;

        /* Get parameters of y subtable. */
        ylist = table->subtables[y].nodelist;
        oldykeys = table->subtables[y].keys;
        yslots = table->subtables[y].slots;
        yshift = table->subtables[y].shift;

        newxkeys = 0;
        newykeys = oldykeys;

        /* Check whether the two projection functions involved in this
        ** swap are isolated. At the end, we'll be able to tell how many
        ** isolated projection functions are there by checking only these
        ** two functions again. This is done to eliminate the isolated
        ** projection functions from the node count.
        */
        isolated = - ((table->vars[xindex]->ref == 1) +
                     (table->vars[yindex]->ref == 1));

        /* The nodes in the x layer are put in a chain.
        ** The chain is handled as a FIFO; g points to the beginning and
        ** last points to the end.
        */
        g = NULL;
#ifdef DD_DEBUG
        last = NULL;
#endif
        for (i = 0; i < xslots; i++) {
            f = xlist[i];
            if (f == sentinel) continue;
            xlist[i] = sentinel;
            if (g == NULL) {
                g = f;
            } else {
                last->next = f;
            }
            while ((next = f->next) != sentinel) {
                f = next;
            } /* while there are elements in the collision chain */
            last = f;
        } /* for each slot of the x subtable */
#ifdef DD_DEBUG
        /* last is always assigned in the for loop because there is at
        ** least one key */
        assert(last != NULL);
#endif
        last->next = NULL;

#ifdef DD_COUNT
        table->swapSteps += oldxkeys;
#endif
        /* Take care of the x nodes that must be re-expressed.
        ** They form a linked list pointed by g.
        */
        f = g;
        while (f != NULL) {
            next = f->next;
            /* Find f1, f0, f11, f10, f01, f00. */
            f1 = cuddT(f);
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(f1)));
#endif
            if ((int) f1->index == yindex) {
                f11 = cuddT(f1); f10 = cuddE(f1);
            } else {
                f11 = f10 = f1;
            }
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(f11)));
#endif
            f0 = cuddE(f);
            comple = Cudd_IsComplement(f0);
            f0 = Cudd_Regular(f0);
            if ((int) f0->index == yindex) {
                f01 = cuddT(f0); f00 = cuddE(f0);
            } else {
                f01 = f00 = f0;
            }
            if (comple) {
                f01 = Cudd_Not(f01);
                f00 = Cudd_Not(f00);
            }
            /* Decrease ref count of f1. */
            cuddSatDec(f1->ref);
            /* Create the new T child. */
            if (f11 == f00) {
                newf1 = f11;
                cuddSatInc(newf1->ref);
            } else {
                /* Check ylist for triple (yindex,f11,f00). */
                posn = ddHash(cuddF2L(f11), cuddF2L(f00), yshift);
                /* For each element newf1 in collision list ylist[posn]. */
                previousP = &(ylist[posn]);
                newf1 = *previousP;
                while (f11 < cuddT(newf1)) {
                    previousP = &(newf1->next);
                    newf1 = *previousP;
                }
                while (f11 == cuddT(newf1) && f00 < cuddE(newf1)) {
                    previousP = &(newf1->next);
                    newf1 = *previousP;
                }
                if (cuddT(newf1) == f11 && cuddE(newf1) == f00) {
                    cuddSatInc(newf1->ref);
                } else { /* no match */
                    newf1 = cuddDynamicAllocNode(table);
                    if (newf1 == NULL)
                        goto cuddLinearOutOfMem;
                    newf1->index = yindex; newf1->ref = 1;
                    cuddT(newf1) = f11;
                    cuddE(newf1) = f00;
                    /* Insert newf1 in the collision list ylist[posn];
                    ** increase the ref counts of f11 and f00.
                    */
                    newykeys++;
                    newf1->next = *previousP;
                    *previousP = newf1;
                    cuddSatInc(f11->ref);
                    tmp = Cudd_Regular(f00);
                    cuddSatInc(tmp->ref);
                }
            }
            cuddT(f) = newf1;
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(newf1)));
#endif

            /* Do the same for f0, keeping complement dots into account. */
            /* decrease ref count of f0 */
            tmp = Cudd_Regular(f0);
            cuddSatDec(tmp->ref);
            /* create the new E child */
            if (f01 == f10) {
                newf0 = f01;
                tmp = Cudd_Regular(newf0);
                cuddSatInc(tmp->ref);
            } else {
                /* make sure f01 is regular */
                newcomplement = Cudd_IsComplement(f01);
                if (newcomplement) {
                    f01 = Cudd_Not(f01);
                    f10 = Cudd_Not(f10);
                }
                /* Check ylist for triple (yindex,f01,f10). */
                posn = ddHash(cuddF2L(f01), cuddF2L(f10), yshift);
                /* For each element newf0 in collision list ylist[posn]. */
                previousP = &(ylist[posn]);
                newf0 = *previousP;
                while (f01 < cuddT(newf0)) {
                    previousP = &(newf0->next);
                    newf0 = *previousP;
                }
                while (f01 == cuddT(newf0) && f10 < cuddE(newf0)) {
                    previousP = &(newf0->next);
                    newf0 = *previousP;
                }
                if (cuddT(newf0) == f01 && cuddE(newf0) == f10) {
                    cuddSatInc(newf0->ref);
                } else { /* no match */
                    newf0 = cuddDynamicAllocNode(table);
                    if (newf0 == NULL)
                        goto cuddLinearOutOfMem;
                    newf0->index = yindex; newf0->ref = 1;
                    cuddT(newf0) = f01;
                    cuddE(newf0) = f10;
                    /* Insert newf0 in the collision list ylist[posn];
                    ** increase the ref counts of f01 and f10.
                    */
                    newykeys++;
                    newf0->next = *previousP;
                    *previousP = newf0;
                    cuddSatInc(f01->ref);
                    tmp = Cudd_Regular(f10);
                    cuddSatInc(tmp->ref);
                }
                if (newcomplement) {
                    newf0 = Cudd_Not(newf0);
                }
            }
            cuddE(f) = newf0;

            /* Re-insert the modified f in xlist.
            ** The modified f does not already exists in xlist.
            ** (Because of the uniqueness of the cofactors.)
            */
            posn = ddHash(cuddF2L(newf1), cuddF2L(newf0), xshift);
            newxkeys++;
            previousP = &(xlist[posn]);
            tmp = *previousP;
            while (newf1 < cuddT(tmp)) {
                previousP = &(tmp->next);
                tmp = *previousP;
            }
            while (newf1 == cuddT(tmp) && newf0 < cuddE(tmp)) {
                previousP = &(tmp->next);
                tmp = *previousP;
            }
            f->next = *previousP;
            *previousP = f;
            f = next;
        } /* while f != NULL */

        /* GC the y layer. */

        /* For each node f in ylist. */
        for (i = 0; i < yslots; i++) {
            previousP = &(ylist[i]);
            f = *previousP;
            while (f != sentinel) {
                next = f->next;
                if (f->ref == 0) {
                    tmp = cuddT(f);
                    cuddSatDec(tmp->ref);
                    tmp = Cudd_Regular(cuddE(f));
                    cuddSatDec(tmp->ref);
                    cuddDeallocNode(table,f);
                    newykeys--;
                } else {
                    *previousP = f;
                    previousP = &(f->next);
                }
                f = next;
            } /* while f */
            *previousP = sentinel;
        } /* for every collision list */

#ifdef DD_DEBUG
#if 0
        (void) fprintf(table->out,"Linearly combining %d and %d\n",x,y);
#endif
        count = 0;
        idcheck = 0;
        for (i = 0; i < yslots; i++) {
            f = ylist[i];
            while (f != sentinel) {
                count++;
                if (f->index != (DdHalfWord) yindex)
                    idcheck++;
                f = f->next;
            }
        }
        if (count != newykeys) {
            fprintf(table->err,"Error in finding newykeys\toldykeys = %d\tnewykeys = %d\tactual = %d\n",oldykeys,newykeys,count);
        }
        if (idcheck != 0)
            fprintf(table->err,"Error in id's of ylist\twrong id's = %d\n",idcheck);
        count = 0;
        idcheck = 0;
        for (i = 0; i < xslots; i++) {
            f = xlist[i];
            while (f != sentinel) {
                count++;
                if (f->index != (DdHalfWord) xindex)
                    idcheck++;
                f = f->next;
            }
        }
        if (count != newxkeys || newxkeys != oldxkeys) {
            fprintf(table->err,"Error in finding newxkeys\toldxkeys = %d \tnewxkeys = %d \tactual = %d\n",oldxkeys,newxkeys,count);
        }
        if (idcheck != 0)
            fprintf(table->err,"Error in id's of xlist\twrong id's = %d\n",idcheck);
#endif

        isolated += (table->vars[xindex]->ref == 1) +
                    (table->vars[yindex]->ref == 1);
        table->isolated += isolated;

        /* Set the appropriate fields in table. */
        table->subtables[y].keys = newykeys;

        /* Here we should update the linear combination table
        ** to record that x <- x EXNOR y. This is done by complementing
        ** the (x,y) entry of the table.
        */

        table->keys += newykeys - oldykeys;

        cuddXorLinear(table,xindex,yindex);
    }

#ifdef DD_DEBUG
    if (zero) {
        (void) Cudd_DebugCheck(table);
    }
#endif

    return(table->keys - table->isolated);

cuddLinearOutOfMem:
    (void) fprintf(table->err,"Error: cuddLinearInPlace out of memory\n");

    return (0);

}